

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::inlined_vector_internal::
IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
::AssignNext(IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
             *this,Pointer<std::allocator<absl::status_internal::Payload>_> assign_at)

{
  reference pPVar1;
  Pointer<std::allocator<absl::status_internal::Payload>_> assign_at_local;
  IteratorValueAdapter<std::allocator<absl::status_internal::Payload>,_std::move_iterator<absl::status_internal::Payload_*>_>
  *this_local;
  
  pPVar1 = std::move_iterator<absl::status_internal::Payload_*>::operator*(&this->it_);
  status_internal::Payload::operator=(assign_at,pPVar1);
  std::move_iterator<absl::status_internal::Payload_*>::operator++(&this->it_);
  return;
}

Assistant:

void AssignNext(Pointer<A> assign_at) {
    *assign_at = *it_;
    ++it_;
  }